

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rattle.cpp
# Opt level: O2

int __thiscall OpenMD::Rattle::constraintPairB(Rattle *this,ConstraintPair *consPair)

{
  RealType RVar1;
  ConstraintElem *this_00;
  ConstraintElem *this_01;
  bool bVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double local_148;
  double dStack_140;
  Vector3d fcons;
  Vector3d delta;
  Vector3d rab;
  Vector3d posA;
  Vector3d dv;
  Vector3d velB;
  Vector3d velA;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Vector3d posB;
  
  this_00 = consPair->consElem1_;
  this_01 = consPair->consElem2_;
  ConstraintElem::getVel((Vector3d *)&velA.super_Vector<double,_3U>,this_00);
  ConstraintElem::getVel((Vector3d *)&velB.super_Vector<double,_3U>,this_01);
  operator-(&posA.super_Vector<double,_3U>,&velA.super_Vector<double,_3U>,
            &velB.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&dv.super_Vector<double,_3U>,&posA.super_Vector<double,_3U>);
  ConstraintElem::getPos((Vector3d *)&posA.super_Vector<double,_3U>,this_00);
  ConstraintElem::getPos((Vector3d *)&posB.super_Vector<double,_3U>,this_01);
  operator-(&delta.super_Vector<double,_3U>,&posA.super_Vector<double,_3U>,
            &posB.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&rab.super_Vector<double,_3U>,&delta.super_Vector<double,_3U>);
  Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&rab.super_Vector<double,_3U>);
  RVar1 = this_01->sd_->mass_;
  auVar6._8_4_ = SUB84(RVar1,0);
  auVar6._0_8_ = this_00->sd_->mass_;
  auVar6._12_4_ = (int)((ulong)RVar1 >> 0x20);
  auVar6 = divpd(_DAT_002470d0,auVar6);
  dVar4 = dot<double,3u>(&rab.super_Vector<double,_3U>,&dv.super_Vector<double,_3U>);
  local_148 = auVar6._0_8_;
  dStack_140 = auVar6._8_8_;
  dVar4 = -dVar4 / ((local_148 + dStack_140) * consPair->dist2);
  dVar5 = ABS(dVar4);
  bVar2 = dVar5 == this->consTolerance_;
  bVar3 = dVar5 < this->consTolerance_;
  if (!bVar3 && !bVar2) {
    operator*(&fcons.super_Vector<double,_3U>,&rab.super_Vector<double,_3U>,dVar4);
    Vector<double,_3U>::Vector(&delta.super_Vector<double,_3U>,&fcons.super_Vector<double,_3U>);
    operator*(&fcons.super_Vector<double,_3U>,local_148,&delta.super_Vector<double,_3U>);
    Vector<double,_3U>::add(&velA.super_Vector<double,_3U>,&fcons.super_Vector<double,_3U>);
    ConstraintElem::setVel(this_00,(Vector3d *)&velA.super_Vector<double,_3U>);
    operator*(&fcons.super_Vector<double,_3U>,dStack_140,&delta.super_Vector<double,_3U>);
    Vector<double,_3U>::sub(&velB.super_Vector<double,_3U>,&fcons.super_Vector<double,_3U>);
    ConstraintElem::setVel(this_01,(Vector3d *)&velB.super_Vector<double,_3U>);
    operator*(&local_78,2.0,&delta.super_Vector<double,_3U>);
    operator/(&local_60,&local_78,this->dt_);
    Vector<double,_3U>::Vector(&fcons.super_Vector<double,_3U>,&local_60);
    dVar4 = Vector<double,_3U>::length(&fcons.super_Vector<double,_3U>);
    dVar5 = dot<double,3u>(&fcons.super_Vector<double,_3U>,&rab.super_Vector<double,_3U>);
    consPair->force_ =
         (double)((ulong)ABS(dVar4) | (ulong)dVar5 & 0x8000000000000000) + consPair->force_;
  }
  return (uint)(bVar3 || bVar2);
}

Assistant:

int Rattle::constraintPairB(ConstraintPair* consPair) {
    ConstraintElem* consElem1 = consPair->getConsElem1();
    ConstraintElem* consElem2 = consPair->getConsElem2();

    Vector3d velA = consElem1->getVel();
    Vector3d velB = consElem2->getVel();

    Vector3d dv = velA - velB;

    Vector3d posA = consElem1->getPos();
    Vector3d posB = consElem2->getPos();

    Vector3d rab = posA - posB;

    currentSnapshot_->wrapVector(rab);

    RealType rma = 1.0 / consElem1->getMass();
    RealType rmb = 1.0 / consElem2->getMass();

    RealType rvab = dot(rab, dv);

    RealType gab = -rvab / ((rma + rmb) * consPair->getConsDistSquare());

    if (fabs(gab) > consTolerance_) {
      Vector3d delta = rab * gab;
      velA += rma * delta;
      consElem1->setVel(velA);

      velB -= rmb * delta;
      consElem2->setVel(velB);

      // report the constraint force back to the constraint pair:

      Vector3d fcons = 2.0 * delta / dt_;
      RealType proj  = copysign(fcons.length(), dot(fcons, rab));

      consPair->addConstraintForce(proj);
      return consSuccess;
    } else {
      return consAlready;
    }
  }